

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

String * kj::anon_unknown_36::generateWebSocketAccept(String *__return_storage_ptr__,StringPtr key)

{
  uchar *data;
  size_t sVar1;
  undefined1 in_R8B;
  ArrayPtr<const_unsigned_char> input;
  kj *local_b8;
  ulong local_b0;
  ArrayPtr<const_unsigned_char> local_a8;
  uchar local_98 [8];
  byte digest [20];
  undefined1 local_7c [8];
  SHA1_CTX ctx;
  StringPtr key_local;
  
  ctx.buffer._56_8_ = key.content.ptr;
  memset(local_98,0,0x14);
  SHA1Init((SHA1_CTX *)local_7c);
  local_a8 = StringPtr::asBytes((StringPtr *)(ctx.buffer + 0x38));
  data = ArrayPtr<const_unsigned_char>::begin(&local_a8);
  sVar1 = StringPtr::size((StringPtr *)(ctx.buffer + 0x38));
  SHA1Update((SHA1_CTX *)local_7c,data,(uint32_t)sVar1);
  SHA1Update((SHA1_CTX *)local_7c,(anonymous_namespace)::WEBSOCKET_GUID,0x24);
  SHA1Final(local_98,(SHA1_CTX *)local_7c);
  ArrayPtr<unsigned_char_const>::ArrayPtr<20ul>
            ((ArrayPtr<unsigned_char_const> *)&local_b8,(uchar (*) [20])local_98);
  input.size_ = 0;
  input.ptr = (uchar *)local_b0;
  encodeBase64(__return_storage_ptr__,local_b8,input,(bool)in_R8B);
  return __return_storage_ptr__;
}

Assistant:

static kj::String generateWebSocketAccept(kj::StringPtr key) {
  // WebSocket demands we do a SHA-1 here. ARRGHH WHY SHA-1 WHYYYYYY?
  SHA1_CTX ctx;
  byte digest[20]{};
  SHA1Init(&ctx);
  SHA1Update(&ctx, key.asBytes().begin(), key.size());
  SHA1Update(&ctx, reinterpret_cast<const byte*>(WEBSOCKET_GUID), strlen(WEBSOCKET_GUID));
  SHA1Final(digest, &ctx);
  return kj::encodeBase64(digest);
}